

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O1

void eig(double *A,int N,double *eigre,double *eigim)

{
  double *pdVar1;
  double dVar2;
  int iVar3;
  double *H;
  int iVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  int N_1;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  undefined4 uVar14;
  uint uVar15;
  double dVar16;
  double dVar17;
  
  lVar6 = (long)N;
  H = (double *)malloc(lVar6 * lVar6 * 8);
  iVar4 = N + -1;
  francis_iter(A,N,H);
  if (1 < N) {
    iVar5 = 0;
    do {
      iVar3 = iVar5 + 1;
      if ((H[iVar3 * N + iVar5] != 0.0) || (NAN(H[iVar3 * N + iVar5]))) {
        pdVar1 = H + (long)(iVar5 * N) + (long)iVar5;
        dVar13 = *pdVar1;
        dVar10 = pdVar1[1];
        dVar9 = pdVar1[lVar6];
        dVar2 = pdVar1[lVar6 + 1];
        dVar16 = dVar10 + dVar9;
        dVar17 = 0.7071067811865475;
        dVar11 = 0.7071067811865475;
        if ((dVar16 != 0.0) || (NAN(dVar16))) {
          dVar17 = (dVar13 - dVar2) / dVar16;
          dVar11 = dVar17 * dVar17 + 1.0;
          if (dVar11 < 0.0) {
            dVar11 = sqrt(dVar11);
          }
          else {
            dVar11 = SQRT(dVar11);
          }
          dVar17 = dVar17 / (dVar11 + 1.0);
          dVar11 = dVar17 * dVar17 + 1.0;
          if (dVar11 < 0.0) {
            dVar11 = sqrt(dVar11);
          }
          else {
            dVar11 = SQRT(dVar11);
          }
          dVar11 = 1.0 / dVar11;
          dVar17 = dVar17 * dVar11;
        }
        dVar8 = dVar17 * dVar17;
        dVar12 = dVar11 * dVar11;
        dVar16 = dVar16 * dVar17 * dVar11;
        dVar11 = (dVar13 - dVar2) * dVar17 * dVar11;
        *pdVar1 = (dVar12 * dVar13 + dVar2 * dVar8) - dVar16;
        pdVar1[1] = (dVar12 * dVar10 - dVar9 * dVar8) + dVar11;
        pdVar1[lVar6] = (dVar12 * dVar9 - dVar10 * dVar8) + dVar11;
        pdVar1[lVar6 + 1] = dVar12 * dVar2 + dVar8 * dVar13 + dVar16;
        iVar3 = iVar5 + 2;
      }
      iVar5 = iVar3;
    } while (iVar3 < iVar4);
  }
  iVar5 = 0;
  if (1 < N) {
    iVar3 = 0;
    do {
      iVar5 = iVar3 + 1;
      lVar6 = (long)(iVar5 * N + iVar3);
      dVar13 = H[lVar6];
      lVar7 = (long)(iVar3 * (N + 1));
      if ((dVar13 != 0.0) || (NAN(dVar13))) {
        dVar10 = H[lVar7 + 1];
        if (0.0 <= dVar13 * dVar10) {
          dVar9 = 0.0;
          if ((dVar10 != 0.0) || (NAN(dVar10))) {
            dVar9 = dVar13 / dVar10;
            if (dVar9 < 0.0) {
              dVar9 = sqrt(dVar9);
            }
            else {
              dVar9 = SQRT(dVar9);
            }
            dVar9 = dVar9 / (dVar9 * dVar9 + 1.0);
          }
          uVar15 = 0;
          uVar14 = 0;
          dVar2 = H[lVar7];
          dVar9 = (dVar13 + dVar10) * dVar9;
          eigre[iVar3] = dVar2 - dVar9;
          eigre[iVar5] = dVar9 + dVar2;
          eigim[iVar3] = 0.0;
        }
        else {
          eigre[iVar3] = H[lVar7];
          eigre[iVar5] = H[lVar6 + 1];
          dVar13 = dVar13 * -dVar10;
          dVar10 = SQRT(dVar13);
          dVar9 = dVar10;
          if (dVar13 < 0.0) {
            dVar9 = sqrt(dVar13);
          }
          eigim[iVar3] = dVar9;
          if (dVar13 < 0.0) {
            dVar10 = sqrt(dVar13);
          }
          uVar15 = (uint)((ulong)dVar10 >> 0x20) ^ 0x80000000;
          uVar14 = SUB84(dVar10,0);
        }
        eigim[iVar5] = (double)CONCAT44(uVar15,uVar14);
        iVar5 = iVar3 + 2;
      }
      else {
        eigre[iVar3] = H[lVar7];
        eigim[iVar3] = 0.0;
      }
      iVar3 = iVar5;
    } while (iVar5 < iVar4);
  }
  if (iVar5 == iVar4) {
    eigre[iVar5] = H[(ulong)(uint)(N * N) - 1];
    eigim[iVar5] = 0.0;
  }
  free(H);
  return;
}

Assistant:

void eig(double *A,int N,double *eigre,double *eigim) {
	int i,t,u,n;
	double *H;
	double t1,t2,cs;
	H = (double*) malloc(sizeof(double) * N * N);
	n = N - 1;
	francis_iter(A,N,H);
	//mdisplay(H,N,N);
	i = 0;
	while (i < n) {
		u = i * N;
		t = (i+1)*N;
		if (H[t+i] != 0.) {
			eig2t(H+u+i,N);
			i = i +2;
		} else {
			i++;
		}
		
	}
	//mdisplay(H,N,N);
	i = 0;
	while (i < n) {
		u = i * N;
		t = (i+1)*N;
		
		if (H[t+i] != 0.) {
			if (H[u+i+1] * H[t+i] < 0.) {
				eigre[i] = H[u+i];
				eigre[i+1] = H[t+i+1];
				eigim[i] = sqrt(-H[u+i+1] * H[t+i]);
				eigim[i+1] = -sqrt(-H[u+i+1] * H[t+i]);
			} else {
				if (H[u+i+1] == 0.) {
					cs = 0.;
				} else {
					t1 = sqrt(H[t+i]/H[u+i+1]);
					t2 = t1 * t1;
					cs = t1/(1+t2);
				}
				eigre[i] = H[u+i] - cs * (H[u+i+1] + H[t+i]);
				eigre[i+1] = H[u+i] + cs * (H[u+i+1] + H[t+i]);
				eigim[i] = 0.;
				eigim[i+1] = 0.;
				
			}
			
			i= i + 2;
			
		} else {
			eigre[i] = H[u+i];
			eigim[i] = 0.;
			i++;
		}
		
	}
	
	if (i == n) {
		eigre[i] = H[N*N - 1];
		eigim[i] = 0.;
	}
	
	free(H);
}